

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_pixarlog.c
# Opt level: O1

int PixarLogEncode(TIFF *tif,uint8_t *bp,tmsize_t cc,uint16_t s)

{
  long lVar1;
  float fVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  ushort uVar10;
  uint8_t *puVar11;
  long lVar12;
  bool bVar13;
  long lVar14;
  float fVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  long lVar19;
  ushort *puVar20;
  char *pcVar21;
  int iVar22;
  uint uVar23;
  ushort *puVar24;
  int iVar25;
  float *pfVar26;
  long lVar27;
  int iVar28;
  long lVar29;
  int iVar30;
  long lVar31;
  int iVar32;
  uint uVar33;
  uint uVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  uint local_50;
  
  puVar11 = tif->tif_data;
  uVar17 = *(uint *)(puVar11 + 0x108);
  if (uVar17 - 2 < 3) {
    cc = (ulong)cc >> 1;
  }
  else if (1 < uVar17) {
    if (uVar17 != 5) {
LAB_002b33c4:
      TIFFErrorExtR(tif,"PixarLogEncode","%u bit input not supported in PixarLog",
                    (ulong)(tif->tif_dir).td_bitspersample);
      return 0;
    }
    cc = (ulong)cc >> 2;
  }
  iVar18 = (uint)*(ushort *)(puVar11 + 0x100) * (tif->tif_dir).td_imagewidth;
  lVar19 = (long)iVar18;
  if ((long)((ulong)(tif->tif_dir).td_rowsperstrip * lVar19) < cc) {
    pcVar21 = "Too many input bytes provided";
  }
  else {
    if (0 < cc) {
      puVar20 = *(ushort **)(puVar11 + 0xf8);
      lVar14 = lVar19 * 2;
      lVar1 = lVar19 * 4;
      iVar25 = iVar18 + 4;
      iVar16 = iVar18 + 3;
      lVar29 = 0;
      do {
        fVar15 = Fltsize;
        iVar32 = *(int *)(puVar11 + 0x108);
        if (iVar32 == 0) {
          uVar3 = *(ushort *)(puVar11 + 0x100);
          lVar27 = lVar19;
          if ((int)(uint)uVar3 <= iVar18) {
            lVar12 = *(long *)(puVar11 + 0x148);
            uVar17 = (uint)uVar3;
            if (uVar17 == 3) {
              uVar5 = *(ushort *)(lVar12 + (ulong)*bp * 2);
              *puVar20 = uVar5;
              uVar6 = *(ushort *)(lVar12 + (ulong)*(byte *)((long)bp + 1) * 2);
              puVar20[1] = uVar6;
              uVar3 = *(ushort *)(lVar12 + (ulong)*(byte *)((long)bp + 2) * 2);
              puVar20[2] = uVar3;
              if (3 < iVar18) {
                lVar31 = 5;
                iVar32 = iVar16;
                do {
                  uVar4 = *(ushort *)(lVar12 + (ulong)*(byte *)((long)bp + lVar31 + -2) * 2);
                  puVar20[lVar31 + -2] = uVar4 - uVar5 & 0x7ff;
                  uVar7 = *(ushort *)(lVar12 + (ulong)*(byte *)((long)bp + lVar31 + -1) * 2);
                  puVar20[lVar31 + -1] = uVar7 - uVar6 & 0x7ff;
                  uVar8 = *(ushort *)(lVar12 + (ulong)*(byte *)((long)bp + lVar31) * 2);
                  puVar20[lVar31] = uVar8 - uVar3 & 0x7ff;
                  lVar31 = lVar31 + 3;
                  iVar32 = iVar32 + -3;
                  uVar5 = uVar4;
                  uVar6 = uVar7;
                  uVar3 = uVar8;
                } while (6 < iVar32);
              }
            }
            else if (uVar17 == 4) {
              uVar4 = *(ushort *)(lVar12 + (ulong)*bp * 2);
              *puVar20 = uVar4;
              uVar5 = *(ushort *)(lVar12 + (ulong)*(byte *)((long)bp + 1) * 2);
              puVar20[1] = uVar5;
              uVar6 = *(ushort *)(lVar12 + (ulong)*(byte *)((long)bp + 2) * 2);
              puVar20[2] = uVar6;
              uVar3 = *(ushort *)(lVar12 + (ulong)*(byte *)((long)bp + 3) * 2);
              puVar20[3] = uVar3;
              if (4 < iVar18) {
                lVar31 = 7;
                iVar32 = iVar25;
                do {
                  uVar7 = *(ushort *)(lVar12 + (ulong)*(byte *)((long)bp + lVar31 + -3) * 2);
                  puVar20[lVar31 + -3] = uVar7 - uVar4 & 0x7ff;
                  uVar8 = *(ushort *)(lVar12 + (ulong)*(byte *)((long)bp + lVar31 + -2) * 2);
                  puVar20[lVar31 + -2] = uVar8 - uVar5 & 0x7ff;
                  uVar9 = *(ushort *)(lVar12 + (ulong)*(byte *)((long)bp + lVar31 + -1) * 2);
                  puVar20[lVar31 + -1] = uVar9 - uVar6 & 0x7ff;
                  uVar10 = *(ushort *)(lVar12 + (ulong)*(byte *)((long)bp + lVar31) * 2);
                  puVar20[lVar31] = uVar10 - uVar3 & 0x7ff;
                  lVar31 = lVar31 + 4;
                  iVar32 = iVar32 + -4;
                  uVar4 = uVar7;
                  uVar5 = uVar8;
                  uVar6 = uVar9;
                  uVar3 = uVar10;
                } while (8 < iVar32);
              }
            }
            else {
              iVar22 = uVar3 + 1;
              puVar24 = puVar20;
              pfVar26 = (float *)bp;
              iVar32 = iVar22;
              do {
                *puVar24 = *(ushort *)(lVar12 + (ulong)*(byte *)pfVar26 * 2);
                puVar24 = puVar24 + 1;
                pfVar26 = (float *)((long)pfVar26 + 1);
                iVar32 = iVar32 + -1;
              } while (1 < iVar32);
              if (iVar18 - uVar17 != 0 && (int)uVar17 <= iVar18) {
                iVar32 = iVar22;
                iVar28 = iVar18 - uVar17;
                do {
                  do {
                    *puVar24 = *(short *)(lVar12 + (ulong)*(byte *)pfVar26 * 2) -
                               *(short *)(lVar12 + (ulong)*(byte *)((long)pfVar26 - (ulong)uVar3) *
                                                   2) & 0x7ff;
                    puVar24 = puVar24 + 1;
                    pfVar26 = (float *)((long)pfVar26 + 1);
                    iVar32 = iVar32 + -1;
                  } while (1 < iVar32);
                  iVar30 = iVar28 - (uint)uVar3;
                  bVar13 = (int)(uint)uVar3 <= iVar28;
                  iVar32 = iVar22;
                  iVar28 = iVar30;
                } while (iVar30 != 0 && bVar13);
              }
            }
          }
        }
        else if (iVar32 == 4) {
          uVar3 = *(ushort *)(puVar11 + 0x100);
          lVar27 = lVar14;
          if ((int)(uint)uVar3 <= iVar18) {
            lVar12 = *(long *)(puVar11 + 0x140);
            uVar17 = (uint)uVar3;
            if (uVar17 == 3) {
              uVar5 = *(ushort *)(lVar12 + (ulong)(*(ushort *)bp >> 2) * 2);
              *puVar20 = uVar5;
              uVar6 = *(ushort *)(lVar12 + (ulong)(*(ushort *)((long)bp + 2) >> 2) * 2);
              puVar20[1] = uVar6;
              uVar3 = *(ushort *)(lVar12 + (ulong)(*(ushort *)((long)bp + 4) >> 2) * 2);
              puVar20[2] = uVar3;
              if (3 < iVar18) {
                lVar31 = 10;
                iVar32 = iVar16;
                do {
                  uVar4 = *(ushort *)
                           (lVar12 + (ulong)(*(ushort *)((long)bp + lVar31 + -4) >> 2) * 2);
                  *(ushort *)((long)puVar20 + lVar31 + -4) = uVar4 - uVar5 & 0x7ff;
                  uVar7 = *(ushort *)
                           (lVar12 + (ulong)(*(ushort *)((long)bp + lVar31 + -2) >> 2) * 2);
                  *(ushort *)((long)puVar20 + lVar31 + -2) = uVar7 - uVar6 & 0x7ff;
                  uVar8 = *(ushort *)(lVar12 + (ulong)(*(ushort *)((long)bp + lVar31) >> 2) * 2);
                  *(ushort *)((long)puVar20 + lVar31) = uVar8 - uVar3 & 0x7ff;
                  lVar31 = lVar31 + 6;
                  iVar32 = iVar32 + -3;
                  uVar5 = uVar4;
                  uVar6 = uVar7;
                  uVar3 = uVar8;
                } while (6 < iVar32);
              }
            }
            else if (uVar17 == 4) {
              uVar4 = *(ushort *)(lVar12 + (ulong)(*(ushort *)bp >> 2) * 2);
              *puVar20 = uVar4;
              uVar5 = *(ushort *)(lVar12 + (ulong)(*(ushort *)((long)bp + 2) >> 2) * 2);
              puVar20[1] = uVar5;
              uVar6 = *(ushort *)(lVar12 + (ulong)(*(ushort *)((long)bp + 4) >> 2) * 2);
              puVar20[2] = uVar6;
              uVar3 = *(ushort *)(lVar12 + (ulong)(*(ushort *)((long)bp + 6) >> 2) * 2);
              puVar20[3] = uVar3;
              if (4 < iVar18) {
                lVar31 = 0xe;
                iVar32 = iVar25;
                do {
                  uVar7 = *(ushort *)
                           (lVar12 + (ulong)(*(ushort *)((long)bp + lVar31 + -6) >> 2) * 2);
                  *(ushort *)((long)puVar20 + lVar31 + -6) = uVar7 - uVar4 & 0x7ff;
                  uVar8 = *(ushort *)
                           (lVar12 + (ulong)(*(ushort *)((long)bp + lVar31 + -4) >> 2) * 2);
                  *(ushort *)((long)puVar20 + lVar31 + -4) = uVar8 - uVar5 & 0x7ff;
                  uVar9 = *(ushort *)
                           (lVar12 + (ulong)(*(ushort *)((long)bp + lVar31 + -2) >> 2) * 2);
                  *(ushort *)((long)puVar20 + lVar31 + -2) = uVar9 - uVar6 & 0x7ff;
                  uVar10 = *(ushort *)(lVar12 + (ulong)(*(ushort *)((long)bp + lVar31) >> 2) * 2);
                  *(ushort *)((long)puVar20 + lVar31) = uVar10 - uVar3 & 0x7ff;
                  lVar31 = lVar31 + 8;
                  iVar32 = iVar32 + -4;
                  uVar4 = uVar7;
                  uVar5 = uVar8;
                  uVar6 = uVar9;
                  uVar3 = uVar10;
                } while (8 < iVar32);
              }
            }
            else {
              iVar22 = uVar3 + 1;
              puVar24 = puVar20;
              pfVar26 = (float *)bp;
              iVar32 = iVar22;
              do {
                *puVar24 = *(ushort *)(lVar12 + (ulong)(*(ushort *)pfVar26 >> 2) * 2);
                puVar24 = puVar24 + 1;
                pfVar26 = (float *)((long)pfVar26 + 2);
                iVar32 = iVar32 + -1;
              } while (1 < iVar32);
              if (iVar18 - uVar17 != 0 && (int)uVar17 <= iVar18) {
                iVar32 = iVar22;
                iVar28 = iVar18 - uVar17;
                do {
                  do {
                    *puVar24 = *(short *)(lVar12 + (ulong)(*(ushort *)pfVar26 >> 2) * 2) -
                               *(short *)(lVar12 + (ulong)(*(ushort *)
                                                            ((long)pfVar26 -
                                                            (ulong)((uint)uVar3 + (uint)uVar3)) >> 2
                                                          ) * 2) & 0x7ff;
                    puVar24 = puVar24 + 1;
                    pfVar26 = (float *)((long)pfVar26 + 2);
                    iVar32 = iVar32 + -1;
                  } while (1 < iVar32);
                  iVar30 = iVar28 - (uint)uVar3;
                  bVar13 = (int)(uint)uVar3 <= iVar28;
                  iVar32 = iVar22;
                  iVar28 = iVar30;
                } while (iVar30 != 0 && bVar13);
              }
            }
          }
        }
        else {
          if (iVar32 != 5) goto LAB_002b33c4;
          uVar3 = *(ushort *)(puVar11 + 0x100);
          lVar27 = lVar1;
          if ((int)(uint)uVar3 <= iVar18) {
            lVar12 = *(long *)(puVar11 + 0x138);
            if (uVar3 == 3) {
              fVar2 = *(float *)bp;
              dVar35 = 0.0;
              if (0.0 <= fVar2) {
                if (2.0 <= fVar2) {
                  dVar35 = 2047.0;
                  if (fVar2 <= 24.2) {
                    dVar35 = (double)LogK1;
                    dVar38 = log((double)(fVar2 * LogK2));
                    dVar35 = dVar38 * dVar35 + 0.5;
                  }
                }
                else {
                  dVar35 = (double)*(ushort *)(lVar12 + (long)(int)(fVar2 * Fltsize) * 2);
                }
              }
              dVar38 = 0.0;
              *puVar20 = (ushort)(int)dVar35;
              fVar2 = *(float *)((long)bp + 4);
              if (0.0 <= fVar2) {
                if (2.0 <= fVar2) {
                  dVar38 = 2047.0;
                  if (fVar2 <= 24.2) {
                    dVar36 = (double)LogK1;
                    dVar38 = log((double)(fVar2 * LogK2));
                    dVar38 = dVar38 * dVar36 + 0.5;
                  }
                }
                else {
                  dVar38 = (double)*(ushort *)(lVar12 + (long)(int)(fVar2 * fVar15) * 2);
                }
              }
              puVar20[1] = (ushort)(int)dVar38;
              fVar2 = *(float *)((long)bp + 8);
              dVar36 = 0.0;
              if (0.0 <= fVar2) {
                if (2.0 <= fVar2) {
                  dVar36 = 2047.0;
                  if (fVar2 <= 24.2) {
                    dVar36 = (double)LogK1;
                    dVar39 = log((double)(fVar2 * LogK2));
                    dVar36 = dVar39 * dVar36 + 0.5;
                  }
                }
                else {
                  dVar36 = (double)*(ushort *)(lVar12 + (long)(int)(fVar2 * fVar15) * 2);
                }
              }
              puVar20[2] = (ushort)(int)dVar36;
              if (3 < iVar18) {
                lVar31 = 10;
                uVar17 = (int)dVar35 & 0xffff;
                uVar34 = (int)dVar38 & 0xffff;
                uVar33 = (int)dVar36 & 0xffff;
                iVar32 = iVar16;
                do {
                  fVar2 = *(float *)((long)bp + lVar31 * 2 + -8);
                  dVar35 = 0.0;
                  if (0.0 <= fVar2) {
                    if (2.0 <= fVar2) {
                      dVar35 = 2047.0;
                      if (fVar2 <= 24.2) {
                        dVar35 = (double)LogK1;
                        dVar38 = log((double)(fVar2 * LogK2));
                        dVar35 = dVar38 * dVar35 + 0.5;
                      }
                    }
                    else {
                      dVar35 = (double)*(ushort *)(lVar12 + (long)(int)(fVar2 * fVar15) * 2);
                    }
                  }
                  dVar38 = 0.0;
                  *(ushort *)((long)puVar20 + lVar31 + -4) =
                       (short)(int)dVar35 - (short)uVar17 & 0x7ff;
                  fVar2 = *(float *)((long)bp + lVar31 * 2 + -4);
                  if (0.0 <= fVar2) {
                    if (2.0 <= fVar2) {
                      dVar38 = 2047.0;
                      if (fVar2 <= 24.2) {
                        dVar36 = (double)LogK1;
                        dVar38 = log((double)(fVar2 * LogK2));
                        dVar38 = dVar38 * dVar36 + 0.5;
                      }
                    }
                    else {
                      dVar38 = (double)*(ushort *)(lVar12 + (long)(int)(fVar2 * fVar15) * 2);
                    }
                  }
                  *(ushort *)((long)puVar20 + lVar31 + -2) =
                       (short)(int)dVar38 - (short)uVar34 & 0x7ff;
                  fVar2 = *(float *)((long)bp + lVar31 * 2);
                  dVar36 = 0.0;
                  if (0.0 <= fVar2) {
                    if (2.0 <= fVar2) {
                      dVar36 = 2047.0;
                      if (fVar2 <= 24.2) {
                        dVar36 = (double)LogK1;
                        dVar39 = log((double)(fVar2 * LogK2));
                        dVar36 = dVar39 * dVar36 + 0.5;
                      }
                    }
                    else {
                      dVar36 = (double)*(ushort *)(lVar12 + (long)(int)(fVar2 * fVar15) * 2);
                    }
                  }
                  *(ushort *)((long)puVar20 + lVar31) = (short)(int)dVar36 - (short)uVar33 & 0x7ff;
                  iVar32 = iVar32 + -3;
                  lVar31 = lVar31 + 6;
                  uVar17 = (int)dVar35;
                  uVar34 = (int)dVar38;
                  uVar33 = (int)dVar36;
                } while (6 < iVar32);
              }
            }
            else if (uVar3 == 4) {
              fVar2 = *(float *)bp;
              dVar35 = 0.0;
              if (0.0 <= fVar2) {
                if (2.0 <= fVar2) {
                  dVar35 = 2047.0;
                  if (fVar2 <= 24.2) {
                    dVar35 = (double)LogK1;
                    dVar38 = log((double)(fVar2 * LogK2));
                    dVar35 = dVar38 * dVar35 + 0.5;
                  }
                }
                else {
                  dVar35 = (double)*(ushort *)(lVar12 + (long)(int)(fVar2 * Fltsize) * 2);
                }
              }
              dVar38 = 0.0;
              *puVar20 = (ushort)(int)dVar35;
              fVar2 = *(float *)((long)bp + 4);
              if (0.0 <= fVar2) {
                if (2.0 <= fVar2) {
                  dVar38 = 2047.0;
                  if (fVar2 <= 24.2) {
                    dVar36 = (double)LogK1;
                    dVar38 = log((double)(fVar2 * LogK2));
                    dVar38 = dVar38 * dVar36 + 0.5;
                  }
                }
                else {
                  dVar38 = (double)*(ushort *)(lVar12 + (long)(int)(fVar2 * fVar15) * 2);
                }
              }
              puVar20[1] = (ushort)(int)dVar38;
              fVar2 = *(float *)((long)bp + 8);
              dVar36 = 0.0;
              if (0.0 <= fVar2) {
                if (2.0 <= fVar2) {
                  dVar36 = 2047.0;
                  if (fVar2 <= 24.2) {
                    dVar36 = (double)LogK1;
                    dVar39 = log((double)(fVar2 * LogK2));
                    dVar36 = dVar39 * dVar36 + 0.5;
                  }
                }
                else {
                  dVar36 = (double)*(ushort *)(lVar12 + (long)(int)(fVar2 * fVar15) * 2);
                }
              }
              dVar39 = 0.0;
              puVar20[2] = (ushort)(int)dVar36;
              fVar2 = *(float *)((long)bp + 0xc);
              if (0.0 <= fVar2) {
                if (2.0 <= fVar2) {
                  dVar39 = 2047.0;
                  if (fVar2 <= 24.2) {
                    dVar37 = (double)LogK1;
                    dVar39 = log((double)(fVar2 * LogK2));
                    dVar39 = dVar39 * dVar37 + 0.5;
                  }
                }
                else {
                  dVar39 = (double)*(ushort *)(lVar12 + (long)(int)(fVar2 * fVar15) * 2);
                }
              }
              puVar20[3] = (ushort)(int)dVar39;
              if (4 < iVar18) {
                lVar31 = 0xe;
                uVar17 = (int)dVar35 & 0xffff;
                uVar34 = (int)dVar38 & 0xffff;
                uVar33 = (int)dVar36 & 0xffff;
                uVar23 = (int)dVar39 & 0xffff;
                iVar32 = iVar25;
                do {
                  fVar2 = *(float *)((long)bp + lVar31 * 2 + -0xc);
                  dVar35 = 0.0;
                  if (0.0 <= fVar2) {
                    if (2.0 <= fVar2) {
                      dVar35 = 2047.0;
                      if (fVar2 <= 24.2) {
                        dVar35 = (double)LogK1;
                        dVar38 = log((double)(fVar2 * LogK2));
                        dVar35 = dVar38 * dVar35 + 0.5;
                      }
                    }
                    else {
                      dVar35 = (double)*(ushort *)(lVar12 + (long)(int)(fVar2 * fVar15) * 2);
                    }
                  }
                  dVar38 = 0.0;
                  *(ushort *)((long)puVar20 + lVar31 + -6) =
                       (short)(int)dVar35 - (short)uVar17 & 0x7ff;
                  fVar2 = *(float *)((long)bp + lVar31 * 2 + -8);
                  if (0.0 <= fVar2) {
                    if (2.0 <= fVar2) {
                      dVar38 = 2047.0;
                      if (fVar2 <= 24.2) {
                        dVar36 = (double)LogK1;
                        dVar38 = log((double)(fVar2 * LogK2));
                        dVar38 = dVar38 * dVar36 + 0.5;
                      }
                    }
                    else {
                      dVar38 = (double)*(ushort *)(lVar12 + (long)(int)(fVar2 * fVar15) * 2);
                    }
                  }
                  *(ushort *)((long)puVar20 + lVar31 + -4) =
                       (short)(int)dVar38 - (short)uVar34 & 0x7ff;
                  fVar2 = *(float *)((long)bp + lVar31 * 2 + -4);
                  dVar36 = 0.0;
                  if (0.0 <= fVar2) {
                    if (2.0 <= fVar2) {
                      dVar36 = 2047.0;
                      if (fVar2 <= 24.2) {
                        dVar36 = (double)LogK1;
                        dVar39 = log((double)(fVar2 * LogK2));
                        dVar36 = dVar39 * dVar36 + 0.5;
                      }
                    }
                    else {
                      dVar36 = (double)*(ushort *)(lVar12 + (long)(int)(fVar2 * fVar15) * 2);
                    }
                  }
                  dVar39 = 0.0;
                  *(ushort *)((long)puVar20 + lVar31 + -2) =
                       (short)(int)dVar36 - (short)uVar33 & 0x7ff;
                  fVar2 = *(float *)((long)bp + lVar31 * 2);
                  if (0.0 <= fVar2) {
                    if (2.0 <= fVar2) {
                      dVar39 = 2047.0;
                      if (fVar2 <= 24.2) {
                        dVar37 = (double)LogK1;
                        dVar39 = log((double)(fVar2 * LogK2));
                        dVar39 = dVar39 * dVar37 + 0.5;
                      }
                    }
                    else {
                      dVar39 = (double)*(ushort *)(lVar12 + (long)(int)(fVar2 * fVar15) * 2);
                    }
                  }
                  *(ushort *)((long)puVar20 + lVar31) = (short)(int)dVar39 - (short)uVar23 & 0x7ff;
                  iVar32 = iVar32 + -4;
                  lVar31 = lVar31 + 8;
                  uVar17 = (int)dVar35;
                  uVar34 = (int)dVar38;
                  uVar33 = (int)dVar36;
                  uVar23 = (int)dVar39;
                } while (8 < iVar32);
              }
            }
            else {
              iVar22 = uVar3 + 1;
              puVar24 = puVar20;
              pfVar26 = (float *)bp;
              iVar32 = iVar22;
              do {
                fVar2 = *pfVar26;
                dVar35 = 0.0;
                if (0.0 <= fVar2) {
                  if (2.0 <= fVar2) {
                    dVar35 = 2047.0;
                    if (fVar2 <= 24.2) {
                      dVar35 = (double)LogK1;
                      dVar38 = log((double)(fVar2 * LogK2));
                      dVar35 = dVar38 * dVar35 + 0.5;
                    }
                  }
                  else {
                    dVar35 = (double)*(ushort *)(lVar12 + (long)(int)(fVar2 * fVar15) * 2);
                  }
                }
                *puVar24 = (ushort)(int)dVar35;
                puVar24 = puVar24 + 1;
                pfVar26 = pfVar26 + 1;
                iVar32 = iVar32 + -1;
              } while (1 < iVar32);
              uVar17 = (uint)uVar3;
              if (iVar18 - uVar17 != 0 && (int)uVar17 <= iVar18) {
                iVar32 = iVar22;
                iVar28 = iVar18 - uVar17;
                do {
                  do {
                    fVar2 = *pfVar26;
                    dVar35 = 0.0;
                    if (0.0 <= fVar2) {
                      if (2.0 <= fVar2) {
                        dVar35 = 2047.0;
                        if (fVar2 <= 24.2) {
                          dVar38 = (double)LogK1;
                          dVar35 = log((double)(fVar2 * LogK2));
                          dVar35 = dVar35 * dVar38 + 0.5;
                        }
                      }
                      else {
                        dVar35 = (double)*(ushort *)(lVar12 + (long)(int)(fVar2 * fVar15) * 2);
                      }
                    }
                    dVar38 = 0.0;
                    fVar2 = *(float *)((long)pfVar26 - (ulong)(uVar17 * 4));
                    if (0.0 <= fVar2) {
                      if (2.0 <= fVar2) {
                        dVar38 = 2047.0;
                        if (fVar2 <= 24.2) {
                          dVar36 = (double)LogK1;
                          dVar38 = log((double)(fVar2 * LogK2));
                          dVar38 = dVar38 * dVar36 + 0.5;
                        }
                      }
                      else {
                        dVar38 = (double)*(ushort *)(lVar12 + (long)(int)(fVar2 * fVar15) * 2);
                      }
                    }
                    *puVar24 = (short)(int)dVar35 - (short)(int)dVar38 & 0x7ff;
                    puVar24 = puVar24 + 1;
                    pfVar26 = pfVar26 + 1;
                    iVar32 = iVar32 + -1;
                  } while (1 < iVar32);
                  local_50 = (uint)uVar3;
                  iVar30 = iVar28 - local_50;
                  bVar13 = (int)local_50 <= iVar28;
                  iVar32 = iVar22;
                  iVar28 = iVar30;
                } while (iVar30 != 0 && bVar13);
              }
            }
          }
        }
        bp = (uint8_t *)((long)bp + lVar27);
        lVar29 = lVar29 + lVar19;
        puVar20 = puVar20 + lVar19;
      } while (lVar29 < cc);
    }
    *(undefined8 *)(puVar11 + 0x80) = *(undefined8 *)(puVar11 + 0xf8);
    *(int *)(puVar11 + 0x88) = (int)cc * 2;
    if (-1 < (int)cc) {
      do {
        iVar18 = deflate((z_streamp)(puVar11 + 0x80),0);
        if (iVar18 != 0) {
          pcVar21 = "(null)";
          if (*(char **)(puVar11 + 0xb0) != (char *)0x0) {
            pcVar21 = *(char **)(puVar11 + 0xb0);
          }
          TIFFErrorExtR(tif,"PixarLogEncode","Encoder error: %s",pcVar21);
          return 0;
        }
        if (*(int *)(puVar11 + 0xa0) == 0) {
          tif->tif_rawcc = tif->tif_rawdatasize;
          iVar18 = TIFFFlushData1(tif);
          if (iVar18 == 0) {
            return 0;
          }
          *(uint8_t **)(puVar11 + 0x98) = tif->tif_rawdata;
          *(int *)(puVar11 + 0xa0) = (int)tif->tif_rawdatasize;
        }
      } while (*(int *)(puVar11 + 0x88) != 0);
      return 1;
    }
    pcVar21 = "ZLib cannot deal with buffers this size";
  }
  TIFFErrorExtR(tif,"PixarLogEncode",pcVar21);
  return 0;
}

Assistant:

static int PixarLogEncode(TIFF *tif, uint8_t *bp, tmsize_t cc, uint16_t s)
{
    static const char module[] = "PixarLogEncode";
    TIFFDirectory *td = &tif->tif_dir;
    PixarLogState *sp = EncoderState(tif);
    tmsize_t i;
    tmsize_t n;
    int llen;
    unsigned short *up;

    (void)s;

    switch (sp->user_datafmt)
    {
        case PIXARLOGDATAFMT_FLOAT:
            n = cc / sizeof(float); /* XXX float == 32 bits */
            break;
        case PIXARLOGDATAFMT_16BIT:
        case PIXARLOGDATAFMT_12BITPICIO:
        case PIXARLOGDATAFMT_11BITLOG:
            n = cc / sizeof(uint16_t); /* XXX uint16_t == 16 bits */
            break;
        case PIXARLOGDATAFMT_8BIT:
        case PIXARLOGDATAFMT_8BITABGR:
            n = cc;
            break;
        default:
            TIFFErrorExtR(tif, module,
                          "%" PRIu16 " bit input not supported in PixarLog",
                          td->td_bitspersample);
            return 0;
    }

    llen = sp->stride * td->td_imagewidth;
    /* Check against the number of elements (of size uint16_t) of sp->tbuf */
    if (n > ((tmsize_t)td->td_rowsperstrip * llen))
    {
        TIFFErrorExtR(tif, module, "Too many input bytes provided");
        return 0;
    }

    for (i = 0, up = sp->tbuf; i < n; i += llen, up += llen)
    {
        switch (sp->user_datafmt)
        {
            case PIXARLOGDATAFMT_FLOAT:
                horizontalDifferenceF((float *)bp, llen, sp->stride, up,
                                      sp->FromLT2);
                bp += llen * sizeof(float);
                break;
            case PIXARLOGDATAFMT_16BIT:
                horizontalDifference16((uint16_t *)bp, llen, sp->stride, up,
                                       sp->From14);
                bp += llen * sizeof(uint16_t);
                break;
            case PIXARLOGDATAFMT_8BIT:
                horizontalDifference8((unsigned char *)bp, llen, sp->stride, up,
                                      sp->From8);
                bp += llen * sizeof(unsigned char);
                break;
            default:
                TIFFErrorExtR(tif, module,
                              "%" PRIu16 " bit input not supported in PixarLog",
                              td->td_bitspersample);
                return 0;
        }
    }

    sp->stream.next_in = (unsigned char *)sp->tbuf;
    assert(sizeof(sp->stream.avail_in) == 4); /* if this assert gets raised,
         we need to simplify this code to reflect a ZLib that is likely updated
         to deal with 8byte memory sizes, though this code will respond
         appropriately even before we simplify it */
    sp->stream.avail_in = (uInt)(n * sizeof(uint16_t));
    if ((sp->stream.avail_in / sizeof(uint16_t)) != (uInt)n)
    {
        TIFFErrorExtR(tif, module, "ZLib cannot deal with buffers this size");
        return (0);
    }

    do
    {
        if (deflate(&sp->stream, Z_NO_FLUSH) != Z_OK)
        {
            TIFFErrorExtR(tif, module, "Encoder error: %s",
                          sp->stream.msg ? sp->stream.msg : "(null)");
            return (0);
        }
        if (sp->stream.avail_out == 0)
        {
            tif->tif_rawcc = tif->tif_rawdatasize;
            if (!TIFFFlushData1(tif))
                return 0;
            sp->stream.next_out = tif->tif_rawdata;
            sp->stream.avail_out =
                (uInt)tif
                    ->tif_rawdatasize; /* this is a safe typecast, as check is
                                          made already in PixarLogPreEncode */
        }
    } while (sp->stream.avail_in > 0);
    return (1);
}